

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroup::RowGroup(RowGroup *this,RowGroupCollection *collection_p,RowGroupPointer *pointer)

{
  unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>,_true> *this_00;
  _Head_base<0UL,_std::atomic<bool>_*,_false> _Var1;
  uint64_t uVar2;
  _Head_base<0UL,_std::atomic<bool>_*,_false> _Var3;
  type paVar4;
  IOException *this_01;
  pointer *__ptr;
  size_t __i;
  string local_50;
  
  uVar2 = pointer->tuple_count;
  (this->super_SegmentBase<duckdb::RowGroup>).start = pointer->row_start;
  (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i = uVar2;
  (this->super_SegmentBase<duckdb::RowGroup>).next._M_b._M_p = (__pointer_type)0x0;
  (this->collection)._M_data = collection_p;
  this_00 = &this->is_loaded;
  this->allocation_size = 0;
  switchD_005700f1::default(&this->version_info,0,0x90);
  if ((long)(pointer->data_pointers).
            super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
            super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pointer->data_pointers).
            super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
            super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>.
            _M_impl.super__Vector_impl_data._M_start >> 4 ==
      ((long)(collection_p->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(collection_p->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::
    _M_move_assign(&(this->column_pointers).
                    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                   ,&pointer->data_pointers);
    ::std::
    vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
    ::resize(&(this->columns).
              super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
             ,(long)(this->column_pointers).
                    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                    .
                    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->column_pointers).
                    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                    .
                    super__Vector_base<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    _Var3._M_head_impl =
         (atomic<bool> *)
         operator_new__((long)(this->columns).
                              super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                              .
                              super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->columns).
                              super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                              .
                              super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4);
    _Var1._M_head_impl =
         (this_00->super_unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>_>)
         ._M_t.super___uniq_ptr_impl<std::atomic<bool>,_std::default_delete<std::atomic<bool>[]>_>.
         _M_t.super__Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>[]>_>
         .super__Head_base<0UL,_std::atomic<bool>_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>_>)._M_t
    .super___uniq_ptr_impl<std::atomic<bool>,_std::default_delete<std::atomic<bool>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>[]>_>.
    super__Head_base<0UL,_std::atomic<bool>_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var1._M_head_impl != (atomic<bool> *)0x0) {
      operator_delete__(_Var1._M_head_impl);
    }
    if ((this->columns).
        super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
        .
        super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->columns).
        super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
        .
        super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __i = 0;
      do {
        paVar4 = unique_ptr<std::atomic<bool>[],_std::default_delete<std::atomic<bool>[]>,_true>::
                 operator[](this_00,__i);
        LOCK();
        (paVar4->_M_base)._M_i = false;
        UNLOCK();
        __i = __i + 1;
      } while (__i < (ulong)((long)(this->columns).
                                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->columns).
                                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    ::std::vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>::
    _M_move_assign(&(this->deletes_pointers).
                    super_vector<duckdb::MetaBlockPointer,_std::allocator<duckdb::MetaBlockPointer>_>
                   ,&pointer->deletes_pointers);
    LOCK();
    (this->deletes_is_loaded)._M_base._M_i = false;
    UNLOCK();
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "Row group column count is unaligned with table column count. Corrupt file?","");
  IOException::IOException(this_01,&local_50);
  __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RowGroup::RowGroup(RowGroupCollection &collection_p, RowGroupPointer pointer)
    : SegmentBase<RowGroup>(pointer.row_start, pointer.tuple_count), collection(collection_p), version_info(nullptr),
      allocation_size(0) {
	// deserialize the columns
	if (pointer.data_pointers.size() != collection_p.GetTypes().size()) {
		throw IOException("Row group column count is unaligned with table column count. Corrupt file?");
	}
	this->column_pointers = std::move(pointer.data_pointers);
	this->columns.resize(column_pointers.size());
	this->is_loaded = unique_ptr<atomic<bool>[]>(new atomic<bool>[columns.size()]);
	for (idx_t c = 0; c < columns.size(); c++) {
		this->is_loaded[c] = false;
	}
	this->deletes_pointers = std::move(pointer.deletes_pointers);
	this->deletes_is_loaded = false;

	Verify();
}